

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  long lVar3;
  long lVar4;
  _Base_ptr in_RCX;
  size_t start_memory;
  uint __seed;
  ulong uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int iVar8;
  EasyUseMap<HashObject<4,_4>,_int> set;
  key_type local_6c;
  char *local_68;
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_68 = title;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::chrono::_V2::steady_clock::now();
  if (0 < iters) {
    iVar8 = 0;
    do {
      local_6c.i_ = iVar8;
      pmVar2 = std::
               map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
               ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                             *)&local_60,&local_6c);
      iVar8 = iVar8 + 1;
      *pmVar2 = iVar8;
    } while (iters != iVar8);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar3 = std::chrono::_V2::steady_clock::now();
  if (iters < 1) {
    __seed = 1;
  }
  else {
    __seed = 1;
    uVar5 = 0;
    do {
      iVar8 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      p_Var6 = &p_Var1->_M_header;
      for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
          p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < iVar8]) {
        if (iVar8 <= (int)*(size_t *)(p_Var7 + 1)) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = p_Var6, iVar8 < (int)p_Var6[1]._M_color)) {
        p_Var7 = &p_Var1->_M_header;
      }
      __seed = __seed ^ (_Rb_tree_header *)p_Var7 != p_Var1;
      uVar5 = uVar5 + 1;
      in_RCX = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while (uVar5 != (uint)iters);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  srand(__seed);
  report(local_68,(double)(lVar4 - lVar3),iters,start_memory,(size_t)in_RCX);
  std::
  _Rb_tree<HashObject<4,_4>,_std::pair<const_HashObject<4,_4>,_int>,_std::_Select1st<std::pair<const_HashObject<4,_4>,_int>_>,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}